

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave_header.cpp
# Opt level: O3

void cinemo::wh::getFmtFromFileHandle(WaveHeader *wh,ifstream *file,header_pos dp)

{
  long lVar1;
  uint16_t *puVar2;
  char buff [256];
  undefined4 local_128;
  
  std::istream::seekg((long)file,dp.second);
  std::istream::read((char *)file,(long)&local_128);
  wh->FormatSize =
       local_128 & 0xff000000 | (int)local_128._2_1_ << 0x10 |
       (int)local_128._1_1_ << 8 | (int)(char)local_128;
  std::istream::read((char *)file,(long)&wh->FormatAudioType);
  std::istream::read((char *)file,(long)&wh->NumberOfChannels);
  std::istream::read((char *)file,(long)&wh->SampleRate);
  std::istream::read((char *)file,(long)&wh->ByteRate);
  std::istream::read((char *)file,(long)&wh->BlockAlign);
  std::istream::read((char *)file,(long)&wh->BitsPerSample);
  lVar1 = std::istream::tellg();
  lVar1 = (((long)dp >> 0x20) - lVar1) + (ulong)wh->FormatSize;
  if (lVar1 == -2) {
    puVar2 = &wh->ExtensionSize;
  }
  else {
    if (lVar1 == -4) goto LAB_00106ff5;
    if (wh->ExtensionSize == 0) {
      std::istream::ignore((long)file);
      goto LAB_00106ff5;
    }
    if (wh->ExtensionSize != 0x16) {
      *(byte *)&(wh->WarningFlags).super__Base_bitset<1UL>._M_w =
           (byte)(wh->WarningFlags).super__Base_bitset<1UL>._M_w | 2;
      goto LAB_00106ff5;
    }
    std::istream::read((char *)file,(long)&wh->ValidBitsPerSample);
    std::istream::read((char *)file,(long)&wh->ChannelMask);
    puVar2 = (uint16_t *)wh->SubFormat;
  }
  std::istream::read((char *)file,(long)puVar2);
LAB_00106ff5:
  std::istream::read((char *)file,(long)&local_128);
  if (wh->HasFact == false) {
    if ((_DAT_0010d3a0 != 4) || (local_128 != *WaveDataString_abi_cxx11_)) {
      *(byte *)&(wh->WarningFlags).super__Base_bitset<1UL>._M_w =
           (byte)(wh->WarningFlags).super__Base_bitset<1UL>._M_w | 2;
    }
  }
  return;
}

Assistant:

void getFmtFromFileHandle(WaveHeader* wh, std::ifstream& file,
                                  header_pos dp) {
            file.seekg(dp.second, std::ios::beg);
            char buff[WaveBufferSize];
            //get format size
            file.read(&buff[0], 4);
            wh->FormatSize = convert4CharTo16_BigEndian(&buff[0]);
            file.read(reinterpret_cast<char*>(&wh->FormatAudioType),
                      sizeof(wh->FormatAudioType));
            file.read(reinterpret_cast<char*>(&wh->NumberOfChannels),
                      sizeof(wh->NumberOfChannels));
            file.read(reinterpret_cast<char*>(&wh->SampleRate),
                      sizeof(wh->SampleRate));
            file.read(reinterpret_cast<char*>(&wh->ByteRate),
                      sizeof(wh->ByteRate));
            file.read(reinterpret_cast<char*>(&wh->BlockAlign),
                      sizeof(wh->BlockAlign));
            file.read(reinterpret_cast<char*>(&wh->BitsPerSample),
                      sizeof(wh->BitsPerSample));

            //check if file is standard fmt with 16 fmt bytes or extended!
            long readSoFar = (static_cast<long>(file.tellg()) - dp.second -
                              4); //4 is for "fmt "
            long leftToRead = wh->FormatSize - readSoFar;

            if (leftToRead == 0) { //Standard FMT read is complete
                //double check, if file is standard, now it should have reach to "data"
                file.read(&buff[0], 4);
                if (!wh->HasFact &&
                    string(&buff[0], 4) != WaveDataString) { //update error flag
                    wh->WarningFlags.set(
                            static_cast<int>(WARNING_NoneStandardExtension), 1);
                }
                return;
            } else if (leftToRead == 2) { //its fmt with 18 bytes
                file.read(reinterpret_cast<char*>(&wh->ExtensionSize),
                          sizeof(wh->ExtensionSize));
                file.read(&buff[0], 4);
                if (!wh->HasFact &&
                    string(&buff[0], 4) != WaveDataString) { //update error flag
                    wh->WarningFlags.set(
                            static_cast<int>(WARNING_NoneStandardExtension), 1);
                }
                return;
            }

            //standard extension sizes are 0 or 22 (0 is set by default in the struct)
            if (wh->ExtensionSize != 0 && wh->ExtensionSize != WaveStandartdExtSize) {
                wh->WarningFlags.set(
                        static_cast<int>(WARNING_NoneStandardExtension), 1);				
            } else if (wh->ExtensionSize == WaveStandartdExtSize) {
				file.read(reinterpret_cast<char*>(&wh->ValidBitsPerSample),
					sizeof(wh->ValidBitsPerSample)); //2
				file.read(reinterpret_cast<char*>(&wh->ChannelMask),
					sizeof(wh->ChannelMask)); //4
				file.read(reinterpret_cast<char*>(&wh->SubFormat[0]),
					sizeof(wh->SubFormat[0]) *
					(wh->ExtensionSize - 6)); //16 byte, [6 = 2 vbps, 4 cm]
			} else { //skip nonstandard extension to reach data...				
				file.ignore(wh->ExtensionSize);
			}
            //by reaching here the next 4 bytes should be "fact" (if it is available)
            // or "data" (other possibilities might exist!!!!)
            file.read(&buff[0], 4);
            if (!wh->HasFact &&
                string(&buff[0], 4) != WaveDataString) { //update error flag
                wh->WarningFlags.set(
                        static_cast<int>(WARNING_NoneStandardExtension), 1);
            }
        }